

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Bmc_MnaSelect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *vLeaves_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (*(long *)pObj < 0) {
    *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff;
    if (pObj->Value != 3) {
      __assert_fail("pObj->Value == GIA_UND",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0xc0,"void Bmc_MnaSelect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    iVar2 = Gia_ObjIsAnd(pObj);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsRo(p,pObj);
      if (iVar2 != 0) {
        pGVar3 = Gia_ObjRoToRi(p,pObj);
        iVar2 = Gia_ObjId(p,pGVar3);
        Vec_IntPush(vLeaves,iVar2);
      }
    }
    else {
      pGVar3 = Gia_ObjFanin0(pObj);
      if (pGVar3->Value == 3) {
        pGVar3 = Gia_ObjFanin0(pObj);
        Bmc_MnaSelect_rec(p,pGVar3,vLeaves);
      }
      else {
        pGVar3 = Gia_ObjFanin0(pObj);
        uVar1 = pGVar3->Value;
        iVar2 = Gia_ObjFaninC0(pObj);
        if (uVar1 + iVar2 != 2) {
          __assert_fail("Gia_ObjFanin0(pObj)->Value + Gia_ObjFaninC0(pObj) == GIA_ONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                        ,0xc5,"void Bmc_MnaSelect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
      }
      pGVar3 = Gia_ObjFanin1(pObj);
      if (pGVar3->Value == 3) {
        pGVar3 = Gia_ObjFanin1(pObj);
        Bmc_MnaSelect_rec(p,pGVar3,vLeaves);
      }
      else {
        pGVar3 = Gia_ObjFanin1(pObj);
        uVar1 = pGVar3->Value;
        iVar2 = Gia_ObjFaninC1(pObj);
        if (uVar1 + iVar2 != 2) {
          __assert_fail("Gia_ObjFanin1(pObj)->Value + Gia_ObjFaninC1(pObj) == GIA_ONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                        ,200,"void Bmc_MnaSelect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
      }
    }
  }
  return;
}

Assistant:

void Bmc_MnaSelect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves )
{
    if ( !pObj->fPhase )
        return;
    pObj->fPhase = 0;
    assert( pObj->Value == GIA_UND );
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            Bmc_MnaSelect_rec( p, Gia_ObjFanin0(pObj), vLeaves );
        else assert( Gia_ObjFanin0(pObj)->Value + Gia_ObjFaninC0(pObj) == GIA_ONE );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            Bmc_MnaSelect_rec( p, Gia_ObjFanin1(pObj), vLeaves );
        else assert( Gia_ObjFanin1(pObj)->Value + Gia_ObjFaninC1(pObj) == GIA_ONE );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vLeaves, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
}